

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

string * __thiscall
QPDFJob::job_json_schema_abi_cxx11_(string *__return_storage_ptr__,QPDFJob *this,int version)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  allocator<char> local_11;
  
  if ((int)this == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "{\n  \"inputFile\": \"input filename\",\n  \"password\": \"password for encrypted file\",\n  \"passwordFile\": \"read password from a file\",\n  \"empty\": \"use empty file as input\",\n  \"jsonInput\": \"input file is qpdf JSON\",\n  \"outputFile\": \"output filename\",\n  \"replaceInput\": \"overwrite input with output\",\n  \"qdf\": \"enable viewing PDF code in a text editor\",\n  \"preserveUnreferenced\": \"preserve unreferenced objects\",\n  \"newlineBeforeEndstream\": \"force a newline before endstream\",\n  \"normalizeContent\": \"fix newlines in content streams\",\n  \"streamData\": \"control stream compression\",\n  \"compressStreams\": \"compress uncompressed streams\",\n  \"recompressFlate\": \"uncompress and recompress flate\",\n  \"decodeLevel\": \"control which streams to uncompress\",\n  \"decrypt\": \"remove encryption from input file\",\n  \"deterministicId\": \"generate ID deterministically\",\n  \"staticAesIv\": \"use a fixed AES vector\",\n  \"staticId\": \"use a fixed document ID\",\n  \"noOriginalObjectIds\": \"omit original object IDs in qdf\",\n  \"copyEncryption\": \"copy another file\'s encryption details\",\n  \"encryptionFilePassword\": \"supply password for copyEncryption\",\n  \"linearize\": \"linearize (web-optimize) output\",\n  \"linearizePass1\": \"save pass 1 of linearization\",\n  \"objectStreams\": \"control use of object streams\",\n  \"minVersion\": \"set minimum PDF version\",\n  \"forceVersion\": \"set output PDF version\",\n  \"progress\": \"show progress when writing\",\n  \"splitPages\": \"write pages to separate files\",\n  \"jsonOutput\": \"apply defaults for JSON serialization\",\n  \"removeRestrictions\": \"remove security restrictions from input file\",\n  \"encrypt\": {\n    \"userPassword\": \"specify user password\",\n    \"ownerPassword\": \"specify owner password\",\n    \"Bits\": null,\n    \"40bit\": {\n      \"annotate\": \"restrict document annotation\",\n      \"extract\": \"restrict text/graphic extraction\",\n      \"modify\": \"restrict document modification\",\n      \"print\": \"restrict printing\"\n    },\n    \"128bit\": {\n      \"accessibility\": \"restrict document accessibility\",\n      \"annotate\": \"restrict document annotation\",\n      \"assembl..." /* TRUNCATED STRING LITERAL */
               ,&local_11);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,version));
  std::runtime_error::runtime_error(this_00,"job_json_schema: version must be 1");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string
QPDFJob::job_json_schema(int version)
{
    if (version != LATEST_JOB_JSON) {
        throw std::runtime_error("job_json_schema: version must be 1");
    }
    return JOB_SCHEMA_DATA;
}